

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_row_mt_sync_read(AV1EncRowMultiThreadSync *row_mt_sync,int r,int c)

{
  long lVar1;
  pthread_mutex_t *__mutex;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  pthread_mutex_t *mutex;
  int nsync;
  
  lVar1 = in_RDI[3];
  if (in_ESI != 0) {
    __mutex = (pthread_mutex_t *)(*in_RDI + (long)(in_ESI + -1) * 0x28);
    pthread_mutex_lock(__mutex);
    while ((*(int *)(in_RDI[2] + (long)(in_ESI + -1) * 4) - (int)lVar1) -
           *(int *)((long)in_RDI + 0x1c) < in_EDX) {
      pthread_cond_wait((pthread_cond_t *)(in_RDI[1] + (long)(in_ESI + -1) * 0x30),__mutex);
    }
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

void av1_row_mt_sync_read(AV1EncRowMultiThreadSync *row_mt_sync, int r, int c) {
#if CONFIG_MULTITHREAD
  const int nsync = row_mt_sync->sync_range;

  if (r) {
    pthread_mutex_t *const mutex = &row_mt_sync->mutex_[r - 1];
    pthread_mutex_lock(mutex);

    while (c > row_mt_sync->num_finished_cols[r - 1] - nsync -
                   row_mt_sync->intrabc_extra_top_right_sb_delay) {
      pthread_cond_wait(&row_mt_sync->cond_[r - 1], mutex);
    }
    pthread_mutex_unlock(mutex);
  }
#else
  (void)row_mt_sync;
  (void)r;
  (void)c;
#endif  // CONFIG_MULTITHREAD
}